

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cartridge.c
# Opt level: O3

void gb_parse_header(GameboyRom *rom,CartridgeHeader *header)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Cartridge_Type CVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  
  puVar2 = rom->data;
  uVar3 = *(undefined8 *)(puVar2 + 0x104);
  uVar4 = *(undefined8 *)(puVar2 + 0x10c);
  uVar5 = *(undefined8 *)(puVar2 + 0x114);
  uVar6 = *(undefined8 *)(puVar2 + 0x11c);
  uVar7 = *(undefined8 *)(puVar2 + 300);
  *(undefined8 *)(header->logo + 0x20) = *(undefined8 *)(puVar2 + 0x124);
  *(undefined8 *)(header->logo + 0x28) = uVar7;
  *(undefined8 *)(header->logo + 0x10) = uVar5;
  *(undefined8 *)(header->logo + 0x18) = uVar6;
  *(undefined8 *)header->logo = uVar3;
  *(undefined8 *)(header->logo + 8) = uVar4;
  uVar3 = *(undefined8 *)(rom->data + 0x13c);
  *(undefined8 *)header->title = *(undefined8 *)(rom->data + 0x134);
  *(undefined8 *)(header->title + 8) = uVar3;
  header->title[0x10] = '\0';
  puVar2 = rom->data;
  header->color_gameboy_only = puVar2[0x143] == 0xc0;
  header->super_gameboy_support = puVar2[0x146] == '\x03';
  CVar8 = MB_UNKNOWN;
  if ((byte)(puVar2[0x147] + 4) < 0x27) {
    CVar8 = *(Cartridge_Type *)(&DAT_00102020 + (ulong)(byte)(puVar2[0x147] + 4) * 4);
  }
  header->type = CVar8;
  iVar9 = 0x20 << (puVar2[0x148] & 0x1f);
  header->rom_size = iVar9;
  header->rom_banks = iVar9 >> 4;
  iVar9 = 0;
  iVar11 = 0;
  if ((byte)(puVar2[0x149] - 2) < 4) {
    lVar10 = (ulong)(byte)(puVar2[0x149] - 2) * 4;
    iVar9 = *(int *)(&DAT_001020bc + lVar10);
    iVar11 = *(int *)(&DAT_001020cc + lVar10);
  }
  header->ram_size = iVar9;
  header->ram_banks = iVar11;
  header->destination = (uint)(puVar2[0x14a] != '\0');
  header->version = puVar2[0x14c];
  uVar1 = puVar2[0x14d];
  header->header_checksum = uVar1;
  header->global_checksum = CONCAT11(uVar1,puVar2[0x14e]);
  return;
}

Assistant:

void gb_parse_header(GameboyRom* rom, CartridgeHeader* header) {

    //Logo
    memcpy(&header->logo[0], &rom->data[LOGO_START], sizeof(uint8_t) * LOGO_SIZE);
    
    //Title
    memcpy(&header->title[0], &rom->data[TITLE_START], sizeof(uint8_t) * TITLE_SIZE);
    header->title[TITLE_SIZE] = '\0';

    //TODO: 0x80 is multi-platform 0xC0 is color gameboy only. What if
    //it contains something else?
    header->color_gameboy_only = rom->data[COLOR_GAMEBOY_FLAG] == 0xC0;

    header->super_gameboy_support = rom->data[SUPER_GAMEBOY_SUPPORT] == 0x03;

    //Cartridge Type
    switch(rom->data[MEMORY_BANK_ADDRESS]) {
        case 0x00: case 0x08: case 0x09:
            header->type = MB_ROM_ONLY;
            break;
        case 0x01: case 0x02: case 0x03:
            header->type = MB_MBC_1;
            break;
        case 0x05: case 0x06:
            header->type = MB_MBC_2;
            break;
        case 0x0B: case 0x0C: case 0x0D:
            header->type = MB_MM01;
            break;
        case 0x0F: case 0x10: case 0x11: case 0x12: case 0x13:
            header->type = MB_MBC_3;
            break;
        case 0x19: case 0x1A: case 0x1B: case 0x1C: case 0x1D: case 0x1E:
            header->type = MB_MBC_5;
            break;
        case 0x20:
            header->type = MB_MBC_6;
            break;
        case 0x22:
            header->type = MB_MBC_7;
            break;
        case 0xFC:
            header->type = MB_POCKET_CAMERA;
            break;
        case 0xFD:
            header->type = MB_BANDAI_TAMA5;
            break;
        default:
            header->type = MB_UNKNOWN;
            break;
    }
    
    //TODO: There are some sizes that are non-standard
    header->rom_size = 32 << rom->data[ROM_SIZE_ADDRESS];
    header->rom_banks = header->rom_size / 16;

    //TODO: What if we get something bigger than 0x05
    switch(rom->data[RAM_SIZE_ADDRESS]) {
        case 0x05:
            header->ram_size = 64;
            break;
        case 0x04:
            header->ram_size = 128;
            break;
        case 0x03:
            header->ram_size = 32;
            break;
        case 0x02:
            header->ram_size = 8;
            break;
        case 0x00: case 0x01:
        default:
            header->ram_size = 0;
            break;
    }
    header->ram_banks = header->ram_size / 8;
    
    header->destination = rom->data[DESTINATION_CODE_ADDRESS] == 0x00 ? DST_JAPAN : DST_WORLD;

    header->version = rom->data[VERSION_ADDRESS];

    header->header_checksum = rom->data[HEADER_CHECKSUM_ADDRESS];
    header->global_checksum = (uint16_t) (rom->data[HEADER_CHECKSUM_ADDRESS] << 8 | rom->data[HEADER_CHECKSUM_ADDRESS + 1]);
}